

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int get_layer_weights(Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights)

{
  bool bVar1;
  undefined8 uVar2;
  value_type *in_RDI;
  InnerProduct *innerproduct;
  ConvolutionDepthWise *convolutiondepthwise;
  Convolution *convolution;
  char *in_stack_ffffffffffffffc8;
  FILE *__stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffd8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDI,in_stack_ffffffffffffffd8);
    if (in_RDI[3].dims != 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (in_stack_ffffffffffffffe0,in_RDI);
      if (in_RDI[3].dims != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                  (in_stack_ffffffffffffffe0,in_RDI);
      }
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (!bVar1) {
        __stream = _stderr;
        uVar2 = std::__cxx11::string::c_str();
        fprintf(__stream,"unexpected layer type %s in get_layer_weights\n",uVar2);
        return -1;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (*(int *)((long)&in_RDI[2].cstep + 4) != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
    }
  }
  return 0;
}

Assistant:

static int get_layer_weights(const ncnn::Layer* layer, std::vector<ncnn::Mat>& weights)
{
    if (layer->type == "Convolution")
    {
        ncnn::Convolution* convolution = (ncnn::Convolution*)layer;
        weights.push_back(convolution->weight_data);
        if (convolution->bias_term)
            weights.push_back(convolution->bias_data);
    }
    else if (layer->type == "ConvolutionDepthWise")
    {
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layer;
        weights.push_back(convolutiondepthwise->weight_data);
        if (convolutiondepthwise->bias_term)
            weights.push_back(convolutiondepthwise->bias_data);
    }
    else if (layer->type == "InnerProduct")
    {
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layer;
        weights.push_back(innerproduct->weight_data);
        if (innerproduct->bias_term)
            weights.push_back(innerproduct->bias_data);
    }
    else
    {
        fprintf(stderr, "unexpected layer type %s in get_layer_weights\n", layer->type.c_str());
        return -1;
    }

    return 0;
}